

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

RegOpnd * __thiscall IR::Instr::FindRegDef(Instr *this,StackSym *sym)

{
  Opnd *this_00;
  bool bVar1;
  RegOpnd *pRVar2;
  
  this_00 = this->m_dst;
  if (((this_00 != (Opnd *)0x0) && (bVar1 = Opnd::IsRegOpnd(this_00), bVar1)) &&
     (pRVar2 = Opnd::AsRegOpnd(this_00), pRVar2->m_sym == sym)) {
    return pRVar2;
  }
  return (RegOpnd *)0x0;
}

Assistant:

IR::RegOpnd *
Instr::FindRegDef(StackSym *sym)
{
    IR::Opnd *dst = this->GetDst();

    if (dst)
    {
        if (dst->IsRegOpnd())
        {
            RegOpnd *regOpnd = dst->AsRegOpnd();

            if (regOpnd->m_sym == sym)
            {
                return regOpnd;
            }
        }
    }

    return nullptr;
}